

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O2

Gia_Man_t * Gia_ManBalanceLut(Gia_Man_t *p,int nLutSize,int nCutNum,int fVerbose)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pNew;
  char *pcVar7;
  uint *puVar8;
  Vec_Int_t *pVVar9;
  Gia_Obj_t *pGVar10;
  Gia_Obj_t *pGVar11;
  Bal_Man_t *p_00;
  Gia_Man_t *p_01;
  int nLevelMax;
  int iVar12;
  uint uVar13;
  
  if (fVerbose != 0) {
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
  }
  pGVar6 = Gia_ManDupMuxes(p,2);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
  }
  Gia_ManFillValue(pGVar6);
  Gia_ManCreateRefs(pGVar6);
  pNew = Gia_ManStart((pGVar6->nObjs * 3) / 2);
  pcVar7 = Abc_UtilStrsav(pGVar6->pName);
  pNew->pName = pcVar7;
  pcVar7 = Abc_UtilStrsav(pGVar6->pSpec);
  pNew->pSpec = pcVar7;
  iVar12 = pNew->nObjsAlloc;
  puVar8 = (uint *)calloc((long)iVar12,4);
  pNew->pMuxes = puVar8;
  pVVar9 = Vec_IntAlloc(iVar12);
  pVVar9->nSize = iVar12;
  if (pVVar9->pArray != (int *)0x0) {
    memset(pVVar9->pArray,0,(long)iVar12 << 2);
  }
  pNew->vLevels = pVVar9;
  pGVar6->pObjs->Value = 0;
  for (iVar12 = 0; iVar12 < pGVar6->vCis->nSize; iVar12 = iVar12 + 1) {
    iVar2 = Vec_IntEntry(pGVar6->vCis,iVar12);
    pGVar10 = Gia_ManObj(pGVar6,iVar2);
    if (pGVar10 == (Gia_Obj_t *)0x0) break;
    pGVar11 = Gia_ManAppendObj(pNew);
    uVar1 = *(ulong *)pGVar11;
    *(ulong *)pGVar11 = uVar1 | 0x9fffffff;
    *(ulong *)pGVar11 =
         uVar1 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
    pVVar9 = pNew->vCis;
    iVar2 = Gia_ObjId(pNew,pGVar11);
    Vec_IntPush(pVVar9,iVar2);
    iVar2 = Gia_ObjId(pNew,pGVar11);
    pGVar10->Value = iVar2 * 2;
  }
  p_00 = Bal_ManAlloc(pGVar6,pNew,nLutSize,nCutNum,fVerbose);
  Gia_ManHashStart(pNew);
  for (iVar12 = 0; iVar12 < pGVar6->vCos->nSize; iVar12 = iVar12 + 1) {
    pGVar10 = Gia_ManCo(pGVar6,iVar12);
    if (pGVar10 == (Gia_Obj_t *)0x0) break;
    Gia_ManBalance_rec(pNew,pGVar6,pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff));
  }
  for (iVar12 = 0; iVar12 < pGVar6->vCos->nSize; iVar12 = iVar12 + 1) {
    pGVar10 = Gia_ManCo(pGVar6,iVar12);
    if (pGVar10 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFanin0Copy(pGVar10);
    iVar3 = Abc_Lit2Var(iVar2);
    if (pNew->nObjs <= iVar3) {
      __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    iVar3 = Abc_Lit2Var(iVar2);
    pGVar11 = Gia_ManObj(pNew,iVar3);
    if ((~*(uint *)pGVar11 & 0x1fffffff) != 0 && (int)*(uint *)pGVar11 < 0) {
      __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
    }
    pGVar11 = Gia_ManAppendObj(pNew);
    *(ulong *)pGVar11 = *(ulong *)pGVar11 | 0x80000000;
    iVar3 = Gia_ObjId(pNew,pGVar11);
    iVar4 = Abc_Lit2Var(iVar2);
    *(ulong *)pGVar11 = *(ulong *)pGVar11 & 0xffffffffe0000000 | (ulong)(iVar3 - iVar4 & 0x1fffffff)
    ;
    iVar2 = Abc_LitIsCompl(iVar2);
    uVar1 = *(ulong *)pGVar11;
    *(ulong *)pGVar11 = uVar1 & 0xffffffffdfffffff | (ulong)(uint)(iVar2 << 0x1d);
    *(ulong *)pGVar11 =
         uVar1 & 0xe0000000dfffffff | (ulong)(uint)(iVar2 << 0x1d) |
         (ulong)(pNew->vCos->nSize & 0x1fffffff) << 0x20;
    pVVar9 = pNew->vCos;
    iVar2 = Gia_ObjId(pNew,pGVar11);
    Vec_IntPush(pVVar9,iVar2);
    if (pNew->pFanData != (int *)0x0) {
      Gia_ObjAddFanout(pNew,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),pGVar11);
    }
    iVar2 = Gia_ObjId(pNew,pGVar11);
    pGVar10->Value = iVar2 * 2;
  }
  uVar13 = 0;
  for (iVar12 = 0; iVar12 < pNew->vCos->nSize; iVar12 = iVar12 + 1) {
    pGVar10 = Gia_ManCo(pNew,iVar12);
    if (pGVar10 == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjId(pNew,pGVar10);
    uVar5 = Bal_ObjDelay(p_00,iVar2 - (*(uint *)pGVar10 & 0x1fffffff));
    if ((int)uVar13 <= (int)uVar5) {
      uVar13 = uVar5;
    }
  }
  printf("Best delay = %d\n",(ulong)uVar13);
  Gia_ManHashStop(pNew);
  Gia_ManSetRegNum(pNew,pGVar6->nRegs);
  Bal_ManFree(p_00);
  p_01 = Gia_ManCleanup(pNew);
  Gia_ManStop(pNew);
  if (fVerbose != 0) {
    Gia_ManPrintStats(p_01,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(pGVar6);
  pGVar6 = Gia_ManDupNoMuxes(p_01,0);
  if (fVerbose != 0) {
    Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
  }
  Gia_ManStop(p_01);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManBalanceLut( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose )
{
    Gia_Man_t * pNew, * pNew1, * pNew2;
    if ( fVerbose )      Gia_ManPrintStats( p, NULL );
    pNew = Gia_ManDupMuxes( p, 2 );
    if ( fVerbose )      Gia_ManPrintStats( pNew, NULL );
    pNew1 = Gia_ManBalanceInt( pNew, nLutSize, nCutNum, fVerbose );
    if ( fVerbose )      Gia_ManPrintStats( pNew1, NULL );
    Gia_ManStop( pNew );
    pNew2 = Gia_ManDupNoMuxes( pNew1, 0 );
    if ( fVerbose )      Gia_ManPrintStats( pNew2, NULL );
    Gia_ManStop( pNew1 );
    return pNew2;
}